

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  NewClassExpressionSyntax *pNVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor local_22;
  DeepCloneVisitor local_21;
  ArgumentListSyntax *local_20;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),&local_22,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x20) == (SyntaxNode *)0x0) {
    local_20 = (ArgumentListSyntax *)0x0;
  }
  else {
    local_20 = (ArgumentListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x20),&local_21,(BumpAllocator *)__child_stack);
  }
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NewClassExpressionSyntax,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*>
                     ((BumpAllocator *)__child_stack,(NameSyntax *)args,&local_20);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NewClassExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NewClassExpressionSyntax>(
        *deepClone<NameSyntax>(*node.scopedNew, alloc),
        node.argList ? deepClone(*node.argList, alloc) : nullptr
    );
}